

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O2

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiMesh>::~TempArray(TempArray<std::vector,_aiMesh> *this)

{
  pointer ppaVar1;
  aiMesh *this_00;
  mywrap *__range3;
  pointer ppaVar2;
  
  ppaVar1 = (this->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar2 = (this->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppaVar2 != ppaVar1; ppaVar2 = ppaVar2 + 1) {
    this_00 = *ppaVar2;
    if (this_00 != (aiMesh *)0x0) {
      aiMesh::~aiMesh(this_00);
    }
    operator_delete(this_00);
  }
  ::std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            ((_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> *)this);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }